

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

bool __thiscall Builder::AddTarget(Builder *this,Node *target,string *err)

{
  Edge *pEVar1;
  bool bVar2;
  bool bVar3;
  pointer ppNVar4;
  vector<Node_*,_std::allocator<Node_*>_> validation_nodes;
  _Vector_base<Node_*,_std::allocator<Node_*>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = DependencyScan::RecomputeDirty
                    (&this->scan_,target,(vector<Node_*,_std::allocator<Node_*>_> *)&local_38,err);
  if (bVar2) {
    if ((target->in_edge_ == (Edge *)0x0) || (target->in_edge_->outputs_ready_ == false)) {
      bVar2 = Plan::AddTarget(&this->plan_,target,err);
      if (!bVar2) goto LAB_00108a64;
    }
    for (ppNVar4 = local_38._M_impl.super__Vector_impl_data._M_start;
        bVar2 = ppNVar4 == local_38._M_impl.super__Vector_impl_data._M_finish, !bVar2;
        ppNVar4 = ppNVar4 + 1) {
      pEVar1 = (*ppNVar4)->in_edge_;
      if ((pEVar1 != (Edge *)0x0) && (pEVar1->outputs_ready_ == false)) {
        bVar3 = Plan::AddTarget(&this->plan_,*ppNVar4,err);
        if (!bVar3) break;
      }
    }
  }
  else {
LAB_00108a64:
    bVar2 = false;
  }
  std::_Vector_base<Node_*,_std::allocator<Node_*>_>::~_Vector_base(&local_38);
  return bVar2;
}

Assistant:

bool Builder::AddTarget(Node* target, string* err) {
  std::vector<Node*> validation_nodes;
  if (!scan_.RecomputeDirty(target, &validation_nodes, err))
    return false;

  Edge* in_edge = target->in_edge();
  if (!in_edge || !in_edge->outputs_ready()) {
    if (!plan_.AddTarget(target, err)) {
      return false;
    }
  }

  // Also add any validation nodes found during RecomputeDirty as top level
  // targets.
  for (std::vector<Node*>::iterator n = validation_nodes.begin();
       n != validation_nodes.end(); ++n) {
    if (Edge* validation_in_edge = (*n)->in_edge()) {
      if (!validation_in_edge->outputs_ready() &&
          !plan_.AddTarget(*n, err)) {
        return false;
      }
    }
  }

  return true;
}